

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O2

void __thiscall camp::Property::set(Property *this,UserObject *object,Value *value)

{
  bool bVar1;
  ForbiddenWrite *__return_storage_ptr__;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string local_88;
  ForbiddenWrite local_68;
  
  bVar1 = writable(this,object);
  if (bVar1) {
    UserObject::set(object,this,value);
    return;
  }
  __return_storage_ptr__ = (ForbiddenWrite *)__cxa_allocate_exception(0x48);
  ForbiddenWrite::ForbiddenWrite(&local_68,&this->m_name);
  std::__cxx11::string::string
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/property.cpp"
             ,&local_a9);
  std::__cxx11::string::string
            ((string *)&local_a8,"void camp::Property::set(const UserObject &, const Value &) const"
             ,&local_aa);
  Error::prepare<camp::ForbiddenWrite>(__return_storage_ptr__,&local_68,&local_88,0x53,&local_a8);
  __cxa_throw(__return_storage_ptr__,&ForbiddenWrite::typeinfo,Error::~Error);
}

Assistant:

void Property::set(const UserObject& object, const Value& value) const
{
    // Check if the property is writable
    if (!writable(object))
        CAMP_ERROR(ForbiddenWrite(name()));

    // Here we don't call setValue directly, we rather let the user object do it
    // and add any processing needed for proper propagation of the modification
    object.set(*this, value);
}